

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int a;
  int b;
  int iVar1;
  uint uVar2;
  float *pfVar3;
  uchar *__ptr;
  long lVar4;
  char *pcVar5;
  int *piVar6;
  long lVar7;
  uchar *puVar8;
  uint uVar9;
  stbi__result_info *in_R9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  float *pfVar13;
  long *in_FS_OFFSET;
  float fVar14;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    piVar6 = comp;
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      pcVar5 = "unknown image type";
    }
    else {
      a = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar3 = (float *)stbi__malloc_mad4(a,b,req_comp,(int)piVar6,iVar1);
      if (pfVar3 != (float *)0x0) {
        uVar2 = req_comp - (uint)((req_comp & 1U) == 0);
        uVar9 = b * a;
        if (0 < (int)uVar9) {
          lVar7 = (long)req_comp;
          uVar11 = (ulong)uVar9;
          uVar12 = 0;
          puVar8 = __ptr;
          pfVar13 = pfVar3;
          do {
            if (0 < (int)uVar2) {
              uVar10 = 0;
              do {
                fVar14 = powf((float)puVar8[uVar10] / 255.0,stbi__l2h_gamma);
                pfVar13[uVar10] = fVar14 * stbi__l2h_scale;
                uVar10 = uVar10 + 1;
              } while (uVar2 != uVar10);
            }
            pfVar13 = pfVar13 + lVar7;
            uVar12 = uVar12 + 1;
            puVar8 = puVar8 + lVar7;
          } while (uVar12 != uVar11);
          if ((req_comp & 1U) == 0) {
            lVar4 = (long)(int)uVar2;
            do {
              pfVar3[lVar4] = (float)__ptr[lVar4] / 255.0;
              lVar4 = lVar4 + lVar7;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
          }
        }
        free(__ptr);
        return pfVar3;
      }
      free(__ptr);
      pcVar5 = "outofmem";
    }
    in_FS_OFFSET[-0x81] = (long)pcVar5;
  }
  else {
    pfVar3 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if (pfVar3 != (float *)0x0) {
      piVar6 = &stbi__vertically_flip_on_load_global;
      if (*(int *)((long)in_FS_OFFSET + -0x3fc) != 0) {
        piVar6 = (int *)(*in_FS_OFFSET + -0x400);
      }
      if (*piVar6 == 0) {
        return pfVar3;
      }
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(pfVar3,*x,*y,req_comp << 2);
      return pfVar3;
    }
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}